

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O2

void __thiscall Socket::Socket(Socket *this,addrinfo *host,int type)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  sockaddr *psVar4;
  system_error *this_00;
  int *piVar5;
  error_category *__ecat;
  addrinfo *rp;
  string local_1d8;
  stringstream stream;
  ostream local_1a8 [376];
  
  this->m_WSAInitialized = 1;
  psVar4 = (sockaddr *)0x0;
  if (type == 2) {
    psVar4 = (sockaddr *)&this->m_SockAddress;
  }
  this->m_DestAddr = psVar4;
  this->m_DestAddrLen = 0;
  do {
    if (host == (addrinfo *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      std::operator<<(local_1a8,"Unable to create socket");
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      __ecat = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this_00,iVar2,__ecat);
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    iVar2 = socket(host->ai_family,type,0);
    this->m_Socket = iVar2;
    if (iVar2 != -1) {
      if (type != 1) {
        uVar3 = host->ai_addrlen;
        this->m_DestAddrLen = uVar3;
LAB_0012bbef:
        uVar1 = 0x80;
        if (uVar3 < 0x80) {
          uVar1 = uVar3;
        }
        memcpy(&this->m_SockAddress,host->ai_addr,(ulong)uVar1);
        return;
      }
      iVar2 = connect(iVar2,(sockaddr *)host->ai_addr,host->ai_addrlen);
      if (iVar2 == 0) {
        uVar3 = host->ai_addrlen;
        goto LAB_0012bbef;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      std::operator<<(local_1a8,"Socket(): connect failed");
      std::__cxx11::stringbuf::str();
      Logger::Log(2,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      close(this->m_Socket);
      this->m_Socket = -1;
    }
    host = host->ai_next;
  } while( true );
}

Assistant:

Socket::Socket(const struct addrinfo* const host, const int type)
    : m_WSAInitialized(!InitSocketLibrary()),
    m_DestAddr(SOCK_DGRAM == type ? reinterpret_cast<const struct sockaddr*>(&m_SockAddress) : nullptr),
    m_DestAddrLen(0)
{
    for (auto rp = host; rp; rp = rp->ai_next) {
        m_Socket = socket(rp->ai_family, type, 0);
        if (INVALID_SOCKET == m_Socket) {
            continue;
        }
        if (SOCK_STREAM == type) {
            if (::connect(m_Socket, rp->ai_addr, rp->ai_addrlen)) {
                LOG_WARN("Socket(): connect failed");
                closesocket(m_Socket);
                m_Socket = INVALID_SOCKET;
                continue;
            }
        } else { /*if (SOCK_DGRAM == type)*/
#if defined(_WIN32) || defined(__CYGWIN__)
            // MSVC on Windows is the only platform using different types for connect() and ai_addrlen ...
            m_DestAddrLen = static_cast<decltype(m_DestAddrLen)>(rp->ai_addrlen);
#else
            m_DestAddrLen = rp->ai_addrlen;
#endif
        }
        memcpy(&m_SockAddress, rp->ai_addr, std::min<size_t>(sizeof(m_SockAddress), rp->ai_addrlen));
        return;
    }
    LOG_ERROR("Unable to create socket");
    throw std::system_error(WSAGetLastError(), std::system_category());
}